

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O2

long strtol0X(char *str,char **endptr,char X,int base)

{
  char cVar1;
  ushort **ppuVar2;
  __int32_t **pp_Var3;
  long lVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  long lStack_40;
  
  ppuVar2 = __ctype_b_loc();
  pcVar6 = str;
  do {
    pcVar5 = pcVar6;
    cVar1 = *pcVar5;
    pcVar6 = pcVar5 + 1;
  } while ((*(byte *)((long)*ppuVar2 + (long)cVar1 * 2 + 1) & 0x20) != 0);
  pcVar7 = pcVar6;
  if ((cVar1 == '+') || (pcVar7 = pcVar5, cVar1 != '-')) {
    lStack_40 = 1;
  }
  else {
    lStack_40 = -1;
    pcVar7 = pcVar6;
  }
  if (((*pcVar7 == '0') &&
      (pp_Var3 = __ctype_toupper_loc(), (*pp_Var3)[pcVar7[1]] == (*pp_Var3)[(byte)X])) &&
     (lVar4 = strtol(pcVar7 + 2,endptr,base), *endptr != pcVar7 + 2)) {
    lVar4 = lVar4 * lStack_40;
  }
  else {
    *endptr = str;
    lVar4 = 0;
  }
  return lVar4;
}

Assistant:

static long int strtol0X(const char * str,
						 const char * *endptr,
						 char X,
						 int base) {
	long int val;               /* stores result */
	int s = 1;                    /* sign is +1 or -1 */
	const char * ptr = str;       /* ptr to current position in str */

	/* skip leading whitespace */
	while (isspace(*ptr)) {
		ptr++;
	}

	/* printf("1) %s\n",ptr); */

	/* scan optional sign character */
	switch (*ptr) {
		case '+':
			ptr++;
			s = 1;
			break;

		case '-':
			ptr++;
			s = -1;
			break;

		default:
			s = 1;
			break;
	}

	/* printf("2) %s\n",ptr); */

	/* '0X' prefix */
	if ((*ptr++) != '0') {
		/* printf("failed to detect '0'\n"); */
		*endptr = str;
		return 0;
	}

	/* printf("3) %s\n",ptr); */
	if (toupper(*ptr++) != toupper(X)) {
		/* printf("failed to detect '%c'\n",X); */
		*endptr = str;
		return 0;
	}

	/* printf("4) %s\n",ptr); */

	/* attempt conversion on remainder of string using strtol() */
	val = strtol(ptr, (char * *)endptr, base);

	if (*endptr == ptr) {
		/* conversion failed */
		*endptr = str;
		return 0;
	}

	/* success */
	return s * val;
}